

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

bool __thiscall
ThreadedReplayer::derived_work_item_is_satisfied<ThreadedReplayer::DeferredGraphicsInfo>
          (ThreadedReplayer *this,DeferredGraphicsInfo *info,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines)

{
  VkPipelineLibraryCreateInfoKHR *library_00;
  bool local_39;
  VkPipelineLibraryCreateInfoKHR *library;
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  *pipelines_local;
  DeferredGraphicsInfo *info_local;
  ThreadedReplayer *this_local;
  
  if (info->info == (VkGraphicsPipelineCreateInfo *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    library_00 = work_item_get_library_info<ThreadedReplayer::DeferredGraphicsInfo>(info);
    local_39 = true;
    if (library_00 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      local_39 = pipeline_library_info_is_satisfied(this,library_00,pipelines);
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool derived_work_item_is_satisfied(const DerivedInfo &info,
	                                    const unordered_map<Hash, VkPipeline> &pipelines) const
	{
		if (!info.info)
			return false;
		auto *library = work_item_get_library_info(info);
		return !library || pipeline_library_info_is_satisfied(*library, pipelines);
	}